

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_signal_set.hpp
# Opt level: O0

void __thiscall
asio::basic_signal_set<asio::any_io_executor>::add
          (basic_signal_set<asio::any_io_executor> *this,int signal_number)

{
  io_object_impl<asio::detail::signal_set_service,_asio::any_io_executor> *in_RDI;
  error_code ec;
  error_code *in_stack_000000e8;
  int in_stack_000000f4;
  implementation_type *in_stack_000000f8;
  signal_set_service *in_stack_00000100;
  char *in_stack_ffffffffffffffb8;
  
  std::error_code::error_code((error_code *)in_RDI);
  detail::io_object_impl<asio::detail::signal_set_service,_asio::any_io_executor>::get_service
            (in_RDI);
  detail::io_object_impl<asio::detail::signal_set_service,_asio::any_io_executor>::
  get_implementation(in_RDI);
  detail::signal_set_service::add
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f4,in_stack_000000e8);
  detail::throw_error((error_code *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void add(int signal_number)
  {
    asio::error_code ec;
    impl_.get_service().add(impl_.get_implementation(), signal_number, ec);
    asio::detail::throw_error(ec, "add");
  }